

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall
wasm::FunctionValidator::validatePoppyExpression(FunctionValidator *this,Expression *curr)

{
  Index *pIVar1;
  bool bVar2;
  If *pIVar3;
  Expression **ppEVar4;
  Iterator IVar5;
  bool local_161;
  Expression *child_1;
  undefined1 local_140 [8];
  Iterator __end2;
  undefined1 local_120 [8];
  Iterator __begin2;
  ChildIterator *__range2;
  Expression *child;
  undefined1 local_b0 [8];
  Iterator __end4;
  undefined1 local_80 [8];
  Iterator __begin4;
  ChildIterator *__range4;
  If *if_;
  Expression *local_18;
  Expression *curr_local;
  FunctionValidator *this_local;
  
  if_._4_4_ = 1;
  local_18 = curr;
  curr_local = (Expression *)this;
  bVar2 = wasm::Type::operator==(&curr->type,(BasicType *)((long)&if_ + 4));
  if (bVar2) {
    bVar2 = StackUtils::mayBeUnreachable(local_18);
    shouldBeTrue<wasm::Expression*>
              (this,bVar2,local_18,
               "Only control flow structures and unreachable polymorphic instructions may be unreachable in Poppy IR"
              );
  }
  bVar2 = Properties::isControlFlowStructure(local_18);
  if (bVar2) {
    pIVar3 = Expression::dynCast<wasm::If>(local_18);
    if (pIVar3 == (If *)0x0) {
      bVar2 = Expression::is<wasm::Block>(local_18);
      if (!bVar2) {
        pIVar1 = &__begin4.index;
        ChildIterator::ChildIterator((ChildIterator *)pIVar1,local_18);
        IVar5 = AbstractChildIterator<wasm::ChildIterator>::begin
                          ((AbstractChildIterator<wasm::ChildIterator> *)pIVar1);
        __end4._8_8_ = IVar5.parent;
        __begin4.parent._0_4_ = IVar5.index;
        local_80 = (undefined1  [8])__end4._8_8_;
        IVar5 = AbstractChildIterator<wasm::ChildIterator>::end
                          ((AbstractChildIterator<wasm::ChildIterator> *)pIVar1);
        local_b0 = (undefined1  [8])IVar5.parent;
        __end4.parent._0_4_ = IVar5.index;
        while (bVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                                 ((Iterator *)local_80,(Iterator *)local_b0), bVar2) {
          ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                              ((Iterator *)local_80);
          bVar2 = Expression::is<wasm::Block>(*ppEVar4);
          shouldBeTrue<wasm::Expression*>
                    (this,bVar2,local_18,"Expected control flow child to be a block");
          AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_80);
        }
        ChildIterator::~ChildIterator((ChildIterator *)&__begin4.index);
      }
    }
    else {
      bVar2 = Expression::is<wasm::Pop>(pIVar3->condition);
      shouldBeTrue<wasm::Expression*>(this,bVar2,local_18,"Expected condition to be a Pop");
      bVar2 = Expression::is<wasm::Block>(pIVar3->ifTrue);
      shouldBeTrue<wasm::Expression*>
                (this,bVar2,local_18,"Expected control flow child to be a block");
      local_161 = true;
      if (pIVar3->ifFalse != (Expression *)0x0) {
        local_161 = Expression::is<wasm::Block>(pIVar3->ifFalse);
      }
      shouldBeTrue<wasm::Expression*>
                (this,local_161,local_18,"Expected control flow child to be a block");
    }
  }
  else {
    pIVar1 = &__begin2.index;
    ChildIterator::ChildIterator((ChildIterator *)pIVar1,local_18);
    IVar5 = AbstractChildIterator<wasm::ChildIterator>::begin
                      ((AbstractChildIterator<wasm::ChildIterator> *)pIVar1);
    __end2._8_8_ = IVar5.parent;
    __begin2.parent._0_4_ = IVar5.index;
    local_120 = (undefined1  [8])__end2._8_8_;
    IVar5 = AbstractChildIterator<wasm::ChildIterator>::end
                      ((AbstractChildIterator<wasm::ChildIterator> *)pIVar1);
    local_140 = (undefined1  [8])IVar5.parent;
    __end2.parent._0_4_ = IVar5.index;
    while (bVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                             ((Iterator *)local_120,(Iterator *)local_140), bVar2) {
      ppEVar4 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                          ((Iterator *)local_120);
      bVar2 = Expression::is<wasm::Pop>(*ppEVar4);
      shouldBeTrue<wasm::Expression*>(this,bVar2,local_18,"Unexpected non-Pop child");
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_120);
    }
    ChildIterator::~ChildIterator((ChildIterator *)&__begin2.index);
  }
  return;
}

Assistant:

void FunctionValidator::validatePoppyExpression(Expression* curr) {
  if (curr->type == Type::unreachable) {
    shouldBeTrue(StackUtils::mayBeUnreachable(curr),
                 curr,
                 "Only control flow structures and unreachable polymorphic"
                 " instructions may be unreachable in Poppy IR");
  }
  if (Properties::isControlFlowStructure(curr)) {
    // Check that control flow children (except If conditions) are blocks
    if (auto* if_ = curr->dynCast<If>()) {
      shouldBeTrue(
        if_->condition->is<Pop>(), curr, "Expected condition to be a Pop");
      shouldBeTrue(if_->ifTrue->is<Block>(),
                   curr,
                   "Expected control flow child to be a block");
      shouldBeTrue(!if_->ifFalse || if_->ifFalse->is<Block>(),
                   curr,
                   "Expected control flow child to be a block");
    } else if (!curr->is<Block>()) {
      for (auto* child : ChildIterator(curr)) {
        shouldBeTrue(child->is<Block>(),
                     curr,
                     "Expected control flow child to be a block");
      }
    }
  } else {
    // Check that all children are Pops
    for (auto* child : ChildIterator(curr)) {
      shouldBeTrue(child->is<Pop>(), curr, "Unexpected non-Pop child");
    }
  }
}